

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O3

Iterator __thiscall
HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::insert
          (HashMap<Socket_*,_Socket::Poll::Private::SocketInfo> *this,Iterator *position,
          Socket **key,SocketInfo *value)

{
  Socket *pSVar1;
  Item *pIVar2;
  uint uVar3;
  SOCKET SVar4;
  Item **ppIVar5;
  ItemBlock *pIVar6;
  Item *pIVar7;
  Item *pIVar8;
  Iterator *pIVar9;
  ulong size;
  
  if (this->data == (Item **)0x0) {
    size = this->capacity << 3;
    ppIVar5 = (Item **)operator_new__(size);
    this->data = ppIVar5;
    Memory::zero(ppIVar5,size);
  }
  else {
    for (pIVar8 = this->data[((ulong)*key >> 3) % this->capacity]; pIVar8 != (Item *)0x0;
        pIVar8 = pIVar8->nextCell) {
      if (pIVar8->key == *key) {
        if (pIVar8 != (this->_end).item) {
          uVar3 = value->events;
          SVar4 = value->s;
          (pIVar8->value).socket = value->socket;
          (pIVar8->value).events = uVar3;
          (pIVar8->value).s = SVar4;
          return (Iterator)pIVar8;
        }
        break;
      }
    }
  }
  pIVar8 = this->freeItem;
  if (pIVar8 == (Item *)0x0) {
    pIVar6 = (ItemBlock *)operator_new__(0xe8);
    pIVar6->next = this->blocks;
    this->blocks = pIVar6;
    pIVar6[0xd].next = (ItemBlock *)0x0;
    pIVar6[0x14].next = pIVar6 + 8;
    pIVar7 = (Item *)(pIVar6 + 0x16);
    pIVar6[0x1b].next = pIVar6 + 0xf;
    pIVar8 = (Item *)(pIVar6 + 1);
  }
  else {
    pIVar7 = pIVar8->prev;
  }
  this->freeItem = pIVar7;
  pSVar1 = *key;
  pIVar8->key = pSVar1;
  uVar3 = value->events;
  SVar4 = value->s;
  (pIVar8->value).socket = value->socket;
  (pIVar8->value).events = uVar3;
  (pIVar8->value).s = SVar4;
  ppIVar5 = this->data + ((ulong)pSVar1 >> 3) % this->capacity;
  pIVar8->cell = ppIVar5;
  pIVar7 = *ppIVar5;
  pIVar8->nextCell = pIVar7;
  if (pIVar7 != (Item *)0x0) {
    pIVar7->cell = &pIVar8->nextCell;
  }
  *ppIVar5 = pIVar8;
  pIVar7 = position->item;
  pIVar2 = pIVar7->prev;
  pIVar8->prev = pIVar2;
  pIVar9 = (Iterator *)&pIVar2->next;
  if (pIVar2 == (Item *)0x0) {
    pIVar9 = &this->_begin;
  }
  pIVar9->item = pIVar8;
  pIVar8->next = pIVar7;
  pIVar7->prev = pIVar8;
  this->_size = this->_size + 1;
  return (Iterator)pIVar8;
}

Assistant:

Iterator insert(const Iterator& position, const T& key, const V& value)
  {
    Iterator it = find(key);
    if(it != _end)
    {
      *it = value;
      return it;
    }

    if(!data)
    {
      data = (Item**)new char[sizeof(Item*) * capacity];
      Memory::zero(data, sizeof(Item*) * capacity);
    }
    
    Item* item;
    if(freeItem)
    {
      item = freeItem;
      freeItem = freeItem->prev;
    }
    else
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      item = (Item*)((char*)itemBlock + sizeof(ItemBlock));

      for(Item* i = item + 1, * end = item + 4; i < end; ++i)
      {
        i->prev = freeItem;
        freeItem = i;
      }
    }

    usize hashCode = hash(key);
#ifdef VERIFY
    VERIFY(new(item) Item(key, value) == item);
#else
    new(item) Item(key, value);
#endif

    Item** cell;
    item->cell = (cell = &data[hashCode % capacity]);
    if((item->nextCell = *cell))
      item->nextCell->cell = &item->nextCell;
    *cell = item;
    
    Item* insertPos = position.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }